

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

double duckdb::TryCastCInternal<bool,double,duckdb::TryCast>
                 (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  double in_RAX;
  double dVar2;
  double result_value;
  double local_8;
  
  local_8 = in_RAX;
  bVar1 = TryCast::Operation<bool,double>
                    (*(bool *)((long)result->deprecated_columns[col].deprecated_data + row),&local_8
                     ,false);
  dVar2 = 0.0;
  if (bVar1) {
    dVar2 = local_8;
  }
  return dVar2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}